

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
          (string *__return_storage_ptr__,UnitTestImpl *this,int skip_count)

{
  long lVar1;
  OsStackTraceGetterInterface *pOVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar2 = os_stack_trace_getter(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*pOVar2->_vptr_OsStackTraceGetterInterface[2])
              (__return_storage_ptr__,pOVar2,(ulong)FLAGS_gtest_stack_trace_depth,
               (ulong)(skip_count + 1));
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string UnitTestImpl::CurrentOsStackTraceExceptTop(int skip_count) {
  return os_stack_trace_getter()->CurrentStackTrace(
      static_cast<int>(GTEST_FLAG(stack_trace_depth)),
      skip_count + 1
      // Skips the user-specified number of frames plus this function
      // itself.
      );  // NOLINT
}